

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  ImSpan<ImGuiTableColumn> *this;
  char cVar1;
  ImGuiSortDirection IVar2;
  ImGuiTableColumn *pIVar3;
  int iVar4;
  int column_n;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int i;
  ulong uVar8;
  bool bVar9;
  
  if ((table->Flags & 8) == 0) {
    __assert_fail("table->Flags & ImGuiTableFlags_Sortable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xa31,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
  }
  this = &table->Columns;
  uVar5 = 0;
  iVar4 = 0;
  for (iVar7 = 0; iVar7 < table->ColumnsCount; iVar7 = iVar7 + 1) {
    pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,iVar7);
    if ((long)pIVar3->SortOrder != 0xffffffffffffffff) {
      if (pIVar3->IsEnabled == false) {
        pIVar3->SortOrder = -1;
      }
      else {
        if (0x3e < iVar4) {
          __assert_fail("sort_order_count < (int)sizeof(sort_order_mask) * 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                        ,0xa3f,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
        }
        iVar4 = iVar4 + 1;
        uVar5 = uVar5 | 1L << ((long)pIVar3->SortOrder & 0x3fU);
      }
    }
  }
  if (iVar4 < 2) {
    bVar9 = false;
  }
  else {
    bVar9 = (table->Flags & 0x4000000) == 0;
  }
  if (1L << ((byte)iVar4 & 0x3f) != uVar5 + 1 || bVar9) {
    uVar5 = 0;
    for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + 1) {
      uVar6 = 0;
      uVar8 = 0xffffffff;
      while( true ) {
        i = (int)uVar8;
        if ((long)table->ColumnsCount <= (long)uVar6) break;
        if ((uVar5 >> (uVar6 & 0x3f) & 1) == 0) {
          pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,(int)uVar6);
          if (pIVar3->SortOrder != -1) {
            if (i != -1) {
              pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,(int)uVar6);
              cVar1 = pIVar3->SortOrder;
              pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,i);
              if (pIVar3->SortOrder <= cVar1) goto LAB_0018a64b;
            }
            uVar8 = uVar6 & 0xffffffff;
          }
        }
LAB_0018a64b:
        uVar6 = uVar6 + 1;
      }
      if (i == -1) {
        __assert_fail("column_with_smallest_sort_order != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0xa50,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
      }
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,i);
      pIVar3->SortOrder = (ImGuiTableColumnIdx)iVar7;
      if (bVar9) {
        iVar4 = 1;
        for (iVar7 = 0; iVar7 < table->ColumnsCount; iVar7 = iVar7 + 1) {
          if (i != iVar7) {
            pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,iVar7);
            pIVar3->SortOrder = -1;
          }
        }
        goto LAB_0018a701;
      }
      uVar5 = uVar5 | 1L << (uVar8 & 0x3f);
    }
  }
  if ((iVar4 == 0) && (iVar4 = 0, (table->Flags & 0x8000000) == 0)) {
    iVar4 = 0;
    for (iVar7 = 0; iVar7 < table->ColumnsCount; iVar7 = iVar7 + 1) {
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,iVar7);
      if ((pIVar3->IsEnabled == true) && ((pIVar3->Flags & 0x100) == 0)) {
        pIVar3->SortOrder = '\0';
        IVar2 = TableGetColumnAvailSortDirection(pIVar3,0);
        pIVar3->field_0x64 = pIVar3->field_0x64 & 0xfc | (byte)IVar2;
        iVar4 = 1;
        break;
      }
    }
  }
LAB_0018a701:
  table->SortSpecsCount = (ImGuiTableColumnIdx)iVar4;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}